

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O0

void qt_rectfill<QRgbaFloat<float>>
               (QRgbaFloat<float> *dest,QRgbaFloat<float> value,int x,int y,int width,int height,
               qsizetype stride)

{
  long lVar1;
  QRgbaFloat<float> value_00;
  QRgbaFloat<float> value_01;
  int in_ECX;
  undefined4 in_EDX;
  float in_ESI;
  int in_R8D;
  ulong in_R9;
  long in_FS_OFFSET;
  int j;
  char *d;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_R9 & 0xffffffff) == (long)in_ECX * 0x10) {
    value_00.g = (float)in_ECX;
    value_00.r = (float)in_R8D;
    value_00.b = (float)in_EDX;
    value_00.a = in_ESI;
    qt_memfill<QRgbaFloat<float>>
              ((QRgbaFloat<float> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               value_00,0xb7a770);
  }
  else {
    for (iVar2 = 0; iVar2 < in_R8D; iVar2 = iVar2 + 1) {
      value_01.g = (float)in_ECX;
      value_01.r = (float)in_R8D;
      value_01.b = (float)in_EDX;
      value_01.a = in_ESI;
      qt_memfill<QRgbaFloat<float>>
                ((QRgbaFloat<float> *)CONCAT44(iVar2,in_stack_ffffffffffffff98),value_01,0xb7a7b3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static
inline void qt_rectfill(T *dest, T value,
                        int x, int y, int width, int height, qsizetype stride)
{
    char *d = reinterpret_cast<char*>(dest + x) + y * stride;
    if (uint(stride) == (width * sizeof(T))) {
        qt_memfill(reinterpret_cast<T*>(d), value, qsizetype(width) * height);
    } else {
        for (int j = 0; j < height; ++j) {
            dest = reinterpret_cast<T*>(d);
            qt_memfill(dest, value, width);
            d += stride;
        }
    }
}